

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint c;
  uint uVar1;
  
  for (; uVar1 = (uint)*ranges, *ranges != 0; ranges = ranges + 2) {
    for (; (uVar1 < 0x10000 && (uVar1 <= ranges[1])); uVar1 = uVar1 + 1) {
      AddChar(this,(ImWchar)uVar1);
    }
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (unsigned int c = ranges[0]; c <= ranges[1] && c <= IM_UNICODE_CODEPOINT_MAX; c++) //-V560
            AddChar((ImWchar)c);
}